

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadPackedData
          (ChimpGroupState<unsigned_int> *this,uint16_t *packed_data,idx_t packed_data_block_count)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  idx_t i;
  ulong local_20;
  
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    PackedDataUtils<unsigned_int>::Unpack
              (*(uint16_t *)(in_RSI + local_20 * 2),(UnpackedData *)(in_RDI + 0x80a + local_20 * 3))
    ;
    if (*(char *)(in_RDI + local_20 * 3 + 0x80b) == '\0') {
      *(undefined1 *)(in_RDI + local_20 * 3 + 0x80b) = 0x40;
    }
    *(undefined1 *)(in_RDI + 0x80a + local_20 * 3) =
         *(undefined1 *)
          ((long)&ChimpConstants::Decompression::LEADING_REPRESENTATION +
          (ulong)*(byte *)(in_RDI + 0x80a + local_20 * 3));
  }
  *(undefined4 *)(in_RDI + 4) = 0;
  *(ulong *)(in_RDI + 0x2428) = in_RDX;
  return;
}

Assistant:

void LoadPackedData(uint16_t *packed_data, idx_t packed_data_block_count) {
		for (idx_t i = 0; i < packed_data_block_count; i++) {
			PackedDataUtils<CHIMP_TYPE>::Unpack(packed_data[i], unpacked_data_blocks[i]);
			if (unpacked_data_blocks[i].significant_bits == 0) {
				unpacked_data_blocks[i].significant_bits = 64;
			}
			unpacked_data_blocks[i].leading_zero =
			    ChimpConstants::Decompression::LEADING_REPRESENTATION[unpacked_data_blocks[i].leading_zero];
		}
		unpacked_index = 0;
		max_packed_data_to_read = packed_data_block_count;
	}